

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

void __thiscall MeshLib::Solid::destroyEdge(Solid *this,Edge *edge)

{
  HalfEdge **ppHVar1;
  Trait **ppTVar2;
  bool bVar3;
  Edge *edge_local;
  Solid *this_local;
  
  ppHVar1 = Edge::halfedge(edge,0);
  bVar3 = false;
  if (*ppHVar1 == (HalfEdge *)0x0) {
    ppHVar1 = Edge::halfedge(edge,1);
    bVar3 = *ppHVar1 == (HalfEdge *)0x0;
  }
  if (!bVar3) {
    __assert_fail("edge->halfedge (0) == NULL && edge->halfedge (1) == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icemiliang[P]spherical_harmonic_maps/src/Solid.cpp"
                  ,0x60,"void MeshLib::Solid::destroyEdge(Edge *)");
  }
  ppTVar2 = Edge::trait(edge);
  if (*ppTVar2 == (Trait *)0x0) {
    AVL::Tree<MeshLib::Edge>::remove(&this->m_edges,(char *)edge);
    if (edge != (Edge *)0x0) {
      Edge::~Edge(edge);
      operator_delete(edge);
    }
    return;
  }
  __assert_fail("edge->trait () == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/icemiliang[P]spherical_harmonic_maps/src/Solid.cpp"
                ,0x61,"void MeshLib::Solid::destroyEdge(Edge *)");
}

Assistant:

void Solid::destroyEdge (Edge * edge)
{
	assert(edge->halfedge (0) == NULL && edge->halfedge (1) == NULL);
	assert(edge->trait () == NULL);
	m_edges.remove (edge);
	delete edge;
}